

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

NameSyntax *
slang::ast::anon_unknown_39::splitScopedName
          (ScopedNameSyntax *syntax,
          SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *nameParts,int *colonParts
          )

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  pointer pNVar4;
  pointer pNVar5;
  int iVar6;
  pointer pNVar7;
  undefined1 *puVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  NameComponents *pNVar12;
  pointer pNVar13;
  undefined8 *puVar14;
  pointer pNVar15;
  pointer pNVar16;
  pointer __src;
  undefined8 *puVar17;
  byte bVar18;
  NameComponents local_78;
  SourceLocation local_40;
  SyntaxKind local_38;
  
  bVar18 = 0;
  do {
    NameComponents::NameComponents(&local_78,(syntax->right).ptr);
    local_40 = parsing::Token::location(&syntax->separator);
    local_38 = (((syntax->right).ptr)->super_ExpressionSyntax).super_SyntaxNode.kind;
    uVar1 = nameParts->len;
    uVar2 = nameParts->cap;
    __src = nameParts->data_ + uVar1;
    if (uVar1 == uVar2) {
      if (uVar1 == 0x1c71c71c71c71c7) {
        slang::detail::throwLengthError();
      }
      uVar11 = uVar1 + 1;
      if (uVar1 + 1 < uVar2 * 2) {
        uVar11 = uVar2 * 2;
      }
      if (0x1c71c71c71c71c7 - uVar2 < uVar2) {
        uVar11 = 0x1c71c71c71c71c7;
      }
      pNVar7 = (pointer)operator_new(uVar11 * 0x48);
      pNVar12 = &local_78;
      pNVar15 = pNVar7 + uVar1;
      for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pNVar15->name).text._M_len = (pNVar12->text)._M_len;
        pNVar12 = (NameComponents *)((long)pNVar12 + ((ulong)bVar18 * -2 + 1) * 8);
        pNVar15 = (pointer)((long)pNVar15 + ((ulong)bVar18 * -2 + 1) * 8);
      }
      pNVar15 = nameParts->data_;
      sVar3 = nameParts->len;
      puVar8 = (undefined1 *)((long)pNVar15 + (sVar3 * 0x48 - (long)__src));
      pNVar4 = pNVar15;
      pNVar5 = pNVar7;
      if (puVar8 == (undefined1 *)0x0) {
        if (sVar3 != 0) {
          lVar9 = 0;
          do {
            puVar14 = (undefined8 *)((long)&(pNVar15->name).text._M_len + lVar9);
            puVar17 = (undefined8 *)((long)&(pNVar7->name).text._M_len + lVar9);
            for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
              *puVar17 = *puVar14;
              puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
              puVar17 = puVar17 + (ulong)bVar18 * -2 + 1;
            }
            lVar9 = lVar9 + 0x48;
          } while (sVar3 * 0x48 != lVar9);
        }
      }
      else {
        for (; pNVar4 != __src; pNVar4 = pNVar4 + 1) {
          pNVar13 = pNVar4;
          pNVar16 = pNVar5;
          for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pNVar16->name).text._M_len = (pNVar13->name).text._M_len;
            pNVar13 = (pointer)((long)pNVar13 + ((ulong)bVar18 * -2 + 1) * 8);
            pNVar16 = (pointer)((long)pNVar16 + ((ulong)bVar18 * -2 + 1) * 8);
          }
          pNVar5 = pNVar5 + 1;
        }
        memcpy(pNVar7 + uVar1 + 1,__src,((ulong)(puVar8 + -0x48) / 0x48) * 0x48 + 0x48);
      }
      if (pNVar15 != (pointer)nameParts->firstElement) {
        operator_delete(pNVar15);
      }
      nameParts->len = nameParts->len + 1;
      nameParts->cap = uVar11;
      nameParts->data_ = pNVar7;
    }
    else {
      pNVar12 = &local_78;
      for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
        (__src->name).text._M_len = (pNVar12->text)._M_len;
        pNVar12 = (NameComponents *)((long)pNVar12 + (ulong)bVar18 * -0x10 + 8);
        __src = (pointer)((long)__src + ((ulong)bVar18 * -2 + 1) * 8);
      }
      nameParts->len = nameParts->len + 1;
    }
    iVar6 = *colonParts + 1;
    if ((syntax->separator).kind == Dot) {
      iVar6 = 0;
    }
    *colonParts = iVar6;
    syntax = (ScopedNameSyntax *)(syntax->left).ptr;
  } while ((syntax->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind == ScopedName);
  return &syntax->super_NameSyntax;
}

Assistant:

const NameSyntax* splitScopedName(const ScopedNameSyntax& syntax,
                                  SmallVectorBase<NamePlusLoc>& nameParts, int& colonParts) {
    // Split the name into easier to manage chunks. The parser will always produce a
    // left-recursive name tree, so that's all we'll bother to handle.
    const ScopedNameSyntax* scoped = &syntax;
    while (true) {
        nameParts.push_back({*scoped->right, scoped->separator.location(), scoped->right->kind});
        if (scoped->separator.kind == TokenKind::Dot)
            colonParts = 0;
        else
            colonParts++;

        if (scoped->left->kind != SyntaxKind::ScopedName)
            break;

        scoped = &scoped->left->as<ScopedNameSyntax>();
    }
    return scoped->left;
}